

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,error_code *ec)

{
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_8;
  
  local_8 = 0x400;
  local_18 = 0x999f30;
  local_10 = 0x999f58;
  basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (this,&local_19,source,&local_18,ec);
  return;
}

Assistant:

basic_cbor_cursor(Sourceable&& source, 
        std::error_code& ec)
        : basic_cbor_cursor(std::allocator_arg, Allocator(),
              std::forward<Sourceable>(source), 
              cbor_decode_options(), 
              ec)
    {
    }